

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  int iVar1;
  undefined1 local_208 [8];
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_fe *rzr_local;
  secp256k1_gej *b_local;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      secp256k1_fe_sqr((secp256k1_fe *)(z12.n + 4),&b->z);
      secp256k1_fe_sqr((secp256k1_fe *)(u1.n + 4),&a->z);
      secp256k1_fe_mul((secp256k1_fe *)(u2.n + 4),&a->x,(secp256k1_fe *)(z12.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(s1.n + 4),&b->x,(secp256k1_fe *)(u1.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(s2.n + 4),&a->y,(secp256k1_fe *)(z12.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(s2.n + 4),(secp256k1_fe *)(s2.n + 4),&b->z);
      secp256k1_fe_mul((secp256k1_fe *)(h.n + 4),&b->y,(secp256k1_fe *)(u1.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(h.n + 4),(secp256k1_fe *)(h.n + 4),&a->z);
      secp256k1_fe_negate((secp256k1_fe *)(i.n + 4),(secp256k1_fe *)(u2.n + 4),1);
      secp256k1_fe_add((secp256k1_fe *)(i.n + 4),(secp256k1_fe *)(s1.n + 4));
      secp256k1_fe_negate((secp256k1_fe *)(i2.n + 4),(secp256k1_fe *)(s2.n + 4),1);
      secp256k1_fe_add((secp256k1_fe *)(i2.n + 4),(secp256k1_fe *)(h.n + 4));
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)(i.n + 4));
      if (iVar1 == 0) {
        secp256k1_fe_sqr((secp256k1_fe *)(h2.n + 4),(secp256k1_fe *)(i2.n + 4));
        secp256k1_fe_sqr((secp256k1_fe *)(h3.n + 4),(secp256k1_fe *)(i.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(i.n + 4),
                         (secp256k1_fe *)(h3.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(i.n + 4),(secp256k1_fe *)(i.n + 4),&b->z);
        if (rzr != (secp256k1_fe *)0x0) {
          memcpy(rzr,i.n + 4,0x28);
        }
        secp256k1_fe_mul(&r->z,&a->z,(secp256k1_fe *)(i.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)local_208,(secp256k1_fe *)(u2.n + 4),
                         (secp256k1_fe *)(h3.n + 4));
        memcpy(r,local_208,0x28);
        secp256k1_fe_mul_int(&r->x,2);
        secp256k1_fe_add(&r->x,(secp256k1_fe *)(t.n + 4));
        secp256k1_fe_negate(&r->x,&r->x,3);
        secp256k1_fe_add(&r->x,(secp256k1_fe *)(h2.n + 4));
        secp256k1_fe_negate(&r->y,&r->x,5);
        secp256k1_fe_add(&r->y,(secp256k1_fe *)local_208);
        secp256k1_fe_mul(&r->y,&r->y,(secp256k1_fe *)(i2.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(t.n + 4),
                         (secp256k1_fe *)(s2.n + 4));
        secp256k1_fe_negate((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(t.n + 4),1);
        secp256k1_fe_add(&r->y,(secp256k1_fe *)(t.n + 4));
      }
      else {
        iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)(i2.n + 4));
        if (iVar1 == 0) {
          if (rzr != (secp256k1_fe *)0x0) {
            secp256k1_fe_set_int(rzr,0);
          }
          secp256k1_gej_set_infinity(r);
        }
        else {
          secp256k1_gej_double_var(r,a,rzr);
        }
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        secp256k1_fe_set_int(rzr,1);
      }
      memcpy(r,a,0x80);
    }
  }
  else {
    memcpy(r,b,0x80);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* Operations: 12 mul, 4 sqr, 2 normalize, 12 mul_int/add/negate */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }

    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    r->infinity = 0;
    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    secp256k1_fe_mul(&h, &h, &b->z);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}